

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

short __thiscall
duckdb::QuantileSortTree::WindowScalar<short,short,true>
          (QuantileSortTree *this,QuantileCursor<short> *data,SubFrames *frames,idx_t n,
          Vector *result,QuantileValue *q)

{
  short sVar1;
  WindowMergeSortTree *this_00;
  idx_t n_00;
  pointer this_01;
  pair<unsigned_long,_unsigned_long> pVar2;
  ID indirect;
  Interpolator<true> interp;
  QuantileIndirect<short> local_60;
  Interpolator<true> local_58;
  
  this_00 = &unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
             ::operator->(&this->index_tree)->super_WindowMergeSortTree;
  WindowMergeSortTree::Build(this_00);
  local_58.desc = false;
  n_00 = Interpolator<true>::Index(q,n);
  local_58.begin = 0;
  local_58.FRN = n_00;
  local_58.CRN = n_00;
  local_58.end = n;
  this_01 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
            ::operator->(&this->index_tree);
  pVar2 = WindowIndexTree::SelectNth(this_01,frames,n_00);
  local_60.data = data;
  sVar1 = Interpolator<true>::Interpolate<unsigned_long,short,duckdb::QuantileIndirect<short>>
                    (&local_58,pVar2.first,pVar2.first,result,&local_60);
  return sVar1;
}

Assistant:

RESULT_TYPE WindowScalar(QuantileCursor<INPUT_TYPE> &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) {
		D_ASSERT(n > 0);

		//	Thread safe and idempotent.
		index_tree->Build();

		//	Find the interpolated indicies within the frame
		Interpolator<DISCRETE> interp(q, n, false);
		const auto lo_data = SelectNth(frames, interp.FRN);
		auto hi_data = lo_data;
		if (interp.CRN != interp.FRN) {
			hi_data = SelectNth(frames, interp.CRN);
		}

		//	Interpolate indirectly
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);
		return interp.template Interpolate<idx_t, RESULT_TYPE, ID>(lo_data, hi_data, result, indirect);
	}